

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.hpp
# Opt level: O3

index_t type_safe::operator+(index_t *lhs,difference_t *rhs)

{
  ulong uVar1;
  ulong uVar2;
  char *message;
  source_location local_10;
  
  uVar1 = (lhs->
          super_strong_typedef<type_safe::index_t,_type_safe::integer<unsigned_long,_type_safe::undefined_behavior_arithmetic>_>
          ).value_.value_;
  if ((long)uVar1 < 0) {
    local_10.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/integer.hpp"
    ;
    local_10.line_number = 0x167;
    message = "conversion would overflow";
  }
  else {
    uVar2 = (rhs->
            super_strong_typedef<type_safe::difference_t,_type_safe::integer<long,_type_safe::undefined_behavior_arithmetic>_>
            ).value_.value_;
    if ((uVar2 ^ 0x7fffffffffffffff) < uVar1 && 0 < (long)uVar2) {
      local_10.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/arithmetic_policy.hpp"
      ;
      local_10.line_number = 0x91;
      message = "addition will result in overflow";
    }
    else {
      if (-1 < (long)(uVar2 + uVar1)) {
        return (index_t)(uVar2 + uVar1);
      }
      local_10.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/integer.hpp"
      ;
      local_10.line_number = 0x186;
      message = "conversion would underflow";
    }
  }
  debug_assert::default_handler::handle(&local_10,"",message);
  abort();
}

Assistant:

constexpr index_t operator+(const index_t& lhs, const difference_t& rhs) noexcept
{
    return index_t(make_unsigned(make_signed(get(lhs)) + get(rhs)));
}